

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::ModeRm
          (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *this,idx_t frame)

{
  size_t sVar1;
  bool bVar2;
  hugeint_t *__k;
  mapped_type *pmVar3;
  
  __k = GetCell(this,frame);
  pmVar3 = ::std::__detail::
           _Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::hugeint_t,_std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::hugeint_t>,_std::hash<duckdb::hugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar1 = pmVar3->count;
  this->nonzero = this->nonzero - (ulong)(sVar1 == 1);
  pmVar3->count = sVar1 - 1;
  if (this->count == sVar1) {
    bVar2 = hugeint_t::operator==(__k,this->mode);
    if (bVar2) {
      this->valid = false;
    }
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}